

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar6;
  undefined8 uVar7;
  bool bVar8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  undefined8 extraout_RAX;
  long lVar10;
  long lVar11;
  _Head_base<0UL,_int_*,_false> _Var12;
  uint uVar13;
  type it;
  int *piVar14;
  rc_data *__last;
  rc_data *ret;
  rc_data *__first;
  long lVar15;
  tuple<int_*,_std::default_delete<int[]>_> tVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 in_XMM4_Qb;
  double local_c0;
  undefined1 local_90 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_80;
  long local_78;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_60;
  double local_58;
  long local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if ((first->current)._M_current != (last->current)._M_current) {
    local_70._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )((long)this + 8);
    dVar23 = kappa / (1.0 - kappa);
    local_68 = first;
    local_60._M_head_impl = (col_value *)last;
    local_58 = theta;
    do {
      iVar19 = (local_68->current)._M_current[-1];
      if (*(int *)(this + 0x80) <= iVar19) {
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
LAB_0018278f:
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_78 = (long)iVar19;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_90,
                 (int)local_70._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                      _M_head_impl);
      if (local_90._8_8_ != local_90._0_8_) {
        lVar22 = *(long *)(this + 0x68);
        _Var12._M_head_impl = (int *)local_90._8_8_;
        do {
          *(double *)(lVar22 + (long)*_Var12._M_head_impl * 8) =
               local_58 * *(double *)(lVar22 + (long)*_Var12._M_head_impl * 8);
          _Var12._M_head_impl = _Var12._M_head_impl + 8;
        } while (_Var12._M_head_impl != (int *)local_90._0_8_);
      }
      if (local_90._8_8_ == local_90._0_8_) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        piVar14 = (int *)local_90._8_8_;
        do {
          sparse_matrix<int>::column
                    ((sparse_matrix<int> *)&local_40,
                     (int)local_70._M_t.
                          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                          .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                          _M_head_impl);
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl ==
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            local_c0 = 0.0;
          }
          else {
            auVar33 = ZEXT864(0) << 0x40;
            do {
              auVar25._0_8_ =
                   (double)*(int *)(*(long *)(this + 0x48) + (long)*local_38._M_head_impl * 4);
              auVar25._8_8_ = in_XMM4_Qb;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x68) + (long)*local_38._M_head_impl * 8);
              auVar1 = vfmadd231sd_fma(auVar33._0_16_,auVar25,auVar1);
              auVar33 = ZEXT1664(auVar1);
              local_38._M_head_impl = local_38._M_head_impl + 2;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_38._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
            local_c0 = auVar1._0_8_;
          }
          lVar22 = *(long *)(this + 0x50);
          lVar21 = uVar20 * 0x10;
          *(int *)(lVar22 + 8 + lVar21) = (int)uVar20;
          *(undefined4 *)(lVar22 + 0xc + lVar21) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*piVar14 * 4);
          dVar24 = quadratic_cost_type<double>::operator()
                             (*(quadratic_cost_type<double> **)(this + 0x70),
                              *(int *)(local_90._8_8_ + 4),x);
          *(double *)(*(long *)(this + 0x50) + lVar21) = dVar24 - local_c0;
          piVar14 = piVar14 + 2;
          uVar20 = uVar20 + 1;
        } while (piVar14 != (int *)local_90._0_8_);
      }
      uVar18 = (uint)uVar20;
      tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)(uVar20 & 0xffffffff);
      if (1 < uVar18) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar16.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl,
                   (int)LZCOUNT(tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar16.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl);
        __last = __first + 1;
        lVar22 = (long)tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl * 0x10 + -0x10;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar22 = lVar22 + -0x10;
        } while (lVar22 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      lVar22 = local_78;
      local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)
           tVar16.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) + local_78 * 0xc) < 1) {
        iVar19 = 0;
        uVar20 = 0xffffffff;
      }
      else {
        lVar21 = 0;
        iVar19 = 0;
        uVar17 = 0xffffffffffffffff;
        do {
          uVar7 = local_90._8_8_;
          uVar20 = uVar17 + 1;
          iVar19 = iVar19 + *(int *)(*(long *)(this + 0x50) + 0xc + lVar21);
          iVar5 = *(int *)(*(long *)(this + 0x58) + lVar22 * 0xc);
          lVar15 = (long)*(int *)(*(long *)(this + 0x50) + 8 + lVar21);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_90._8_8_ + (lVar15 * 2 + 1) * 4));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar23;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = delta;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(double *)(*(long *)(this + 0x50) + lVar21) * 0.5;
          auVar1 = vfmadd213sd_fma(auVar26,auVar30,auVar2);
          *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar15 * 2 * 4) * 8) =
               auVar1._0_8_ +
               *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar15 * 2 * 4) * 8);
          if (iVar5 <= iVar19) break;
          lVar21 = lVar21 + 0x10;
          bVar8 = (long)uVar17 < (long)(int)uVar18 + -2;
          uVar17 = uVar20;
        } while (bVar8);
        uVar18 = (uint)local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl;
      }
      uVar13 = (uint)uVar20;
      if (iVar19 < *(int *)(*(long *)(this + 0x58) + lVar22 * 0xc)) {
        bVar8 = false;
      }
      else {
        bVar8 = iVar19 <= *(int *)(*(long *)(this + 0x58) + lVar22 * 0xc + 4);
      }
      if (((int)(uVar13 + 1) < (int)uVar18) && (bVar8)) {
        local_48 = (long)(int)uVar18;
        lVar21 = (long)(int)uVar13 << 4;
        lVar15 = (long)(int)uVar13 + 2;
        do {
          uVar7 = local_90._8_8_;
          lVar11 = *(long *)(this + 0x50);
          iVar19 = iVar19 + *(int *)(lVar11 + 0x1c + lVar21);
          if (iVar19 < *(int *)(*(long *)(this + 0x58) + lVar22 * 0xc)) {
            bVar8 = false;
          }
          else {
            bVar8 = iVar19 <= *(int *)(*(long *)(this + 0x58) + lVar22 * 0xc + 4);
          }
          lVar10 = (long)*(int *)(lVar11 + 0x18 + lVar21);
          if (bVar8) {
            dVar24 = *(double *)(lVar11 + 0x10 + lVar21);
            if ((dVar24 != 0.0) || (NAN(dVar24))) {
              bVar8 = dVar24 < 0.0;
            }
            else {
              local_50 = lVar10;
              dVar24 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar8 = dVar24 < 0.5;
              lVar10 = local_50;
            }
          }
          if (bVar8) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar7 + (lVar10 * 2 + 1) * 4));
            lVar11 = *(long *)(this + 0x68);
            auVar31._8_8_ = 0;
            auVar31._0_8_ = dVar23;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = delta;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar21) * 0.5;
            auVar1 = vfmadd213sd_fma(auVar27,auVar31,auVar3);
            lVar10 = (long)*(int *)(uVar7 + lVar10 * 2 * 4);
            dVar24 = auVar1._0_8_ + *(double *)(lVar11 + lVar10 * 8);
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar7 + (lVar10 * 2 + 1) * 4));
            lVar11 = *(long *)(this + 0x68);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = dVar23;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = delta;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar21) * 0.5;
            auVar1 = vfmadd213sd_fma(auVar28,auVar32,auVar4);
            lVar10 = (long)*(int *)(uVar7 + lVar10 * 2 * 4);
            dVar24 = *(double *)(lVar11 + lVar10 * 8) - auVar1._0_8_;
          }
          *(double *)(lVar11 + lVar10 * 8) = dVar24;
          bVar6 = lVar15 < local_48;
          uVar13 = (int)uVar20 + 1;
          uVar20 = (ulong)uVar13;
          lVar21 = lVar21 + 0x10;
          lVar15 = lVar15 + 1;
        } while ((bool)(bVar6 & bVar8));
      }
      if ((int)(uVar13 + 1) <
          (int)local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar22 = (long)(int)uVar13 << 4;
        iVar19 = ~uVar13 + (int)local_80._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl;
        do {
          uVar7 = local_90._8_8_;
          lVar21 = (long)*(int *)(*(long *)(this + 0x50) + 0x18 + lVar22);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_90._8_8_ + (lVar21 * 2 + 1) * 4));
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar23;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = delta;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar22) * 0.5;
          auVar1 = vfmadd213sd_fma(auVar29,auVar35,auVar34);
          *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar21 * 2 * 4) * 8) =
               *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar21 * 2 * 4) * 8) -
               auVar1._0_8_;
          lVar22 = lVar22 + 0x10;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      bVar8 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                          *)this,(int)local_78,x);
      if (!bVar8) goto LAB_0018278f;
      _Var9._M_current = (local_68->current)._M_current + -1;
      (local_68->current)._M_current = _Var9._M_current;
    } while (_Var9._M_current != *(int **)local_60._M_head_impl);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }